

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O2

double __thiscall
LargeGapGrayCode::computeGapVariance
          (LargeGapGrayCode *this,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *runLengths)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_header *p_Var3;
  int iVar4;
  const_iterator it;
  int iVar5;
  int iVar6;
  double dVar7;
  
  p_Var3 = &(runLengths->_M_t)._M_impl.super__Rb_tree_header;
  iVar5 = 0;
  iVar4 = 0;
  p_Var2 = (runLengths->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var1 = p_Var2; (_Rb_tree_header *)p_Var1 != p_Var3;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    iVar4 = iVar4 + p_Var1[1]._M_color * *(int *)&p_Var1[1].field_0x4;
    iVar5 = iVar5 + *(int *)&p_Var1[1].field_0x4;
  }
  iVar6 = 0;
  for (; (_Rb_tree_header *)p_Var2 != p_Var3;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    dVar7 = (double)(int)p_Var2[1]._M_color - (double)iVar4 / (double)iVar5;
    iVar6 = (int)((double)*(int *)&p_Var2[1].field_0x4 * dVar7 * dVar7 + (double)iVar6);
  }
  return (double)iVar6 / (double)iVar5;
}

Assistant:

double LargeGapGrayCode::computeGapVariance(const std::map<int, int>& runLengths)
{
	int sum = 0;
	int runs = 0;

	for(std::map<int, int>::const_iterator it = runLengths.begin(); it != runLengths.end(); ++it) {
		sum += it->first * it->second;
		runs += it->second;
	}

	double mean = (double)sum/runs;

	int squaredDiff = 0;
	for(std::map<int, int>::const_iterator it = runLengths.begin(); it != runLengths.end(); ++it) {
		squaredDiff += (it->first-mean)*(it->first-mean) * it->second;
	}

	double variance = (double)squaredDiff/runs;

	return variance;
}